

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

void on_data(intptr_t sockfd,fio_protocol_s *ws_)

{
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var1;
  byte bVar2;
  ssize_t sVar3;
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var4;
  uint uVar5;
  ulong uVar6;
  buffer_s bVar7;
  
  if (ws_ == (fio_protocol_s *)0x0) {
    return;
  }
  p_Var1 = ws_[3].on_data;
  p_Var4 = ws_[3].on_shutdown;
  if (&DAT_00000001 < p_Var4) {
    bVar2 = (byte)p_Var1[1] >> 5 & 4;
    uVar5 = (byte)p_Var1[1] & 0x7f;
    uVar6 = (ulong)uVar5;
    if (uVar6 == 0x7f) {
      if (p_Var4 < (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0xa) {
        bVar2 = bVar2 | 10;
        goto LAB_0015cbac;
      }
      if ((byte)p_Var1[2] < 0x40) {
        uVar6 = (ulong)(byte)p_Var1[9] |
                (ulong)(byte)p_Var1[7] << 0x10 |
                (ulong)(byte)p_Var1[6] << 0x18 |
                (ulong)(byte)p_Var1[5] << 0x20 |
                (ulong)(byte)p_Var1[4] << 0x28 |
                (ulong)(byte)p_Var1[3] << 0x30 | (ulong)(byte)p_Var1[2] << 0x38 |
                (ulong)(byte)p_Var1[8] << 8;
        bVar2 = bVar2 | 10;
      }
      else {
        uVar6 = 0;
        bVar2 = 0;
      }
    }
    else if (uVar5 == 0x7e) {
      if (p_Var4 < (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x4) {
        bVar2 = bVar2 + 4;
        goto LAB_0015cbac;
      }
      uVar6 = (ulong)(ushort)(*(ushort *)(p_Var1 + 2) << 8 | *(ushort *)(p_Var1 + 2) >> 8);
      bVar2 = bVar2 + 4;
    }
    else {
      bVar2 = bVar2 | 2;
    }
  }
  else {
    bVar2 = 2;
LAB_0015cbac:
    uVar6 = 0;
  }
  bVar7.size = (_func_void_intptr_t_fio_protocol_s_ptr *)(bVar2 + uVar6);
  if (bVar7.size <= ws_[2].on_ready) {
    if (ws_[3].on_ready < bVar7.size) {
      ws_[3].on_ready = bVar7.size;
      bVar7.data = p_Var1;
      bVar7 = resize_ws_buffer((ws_s *)ws_,bVar7);
      ws_[3].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)bVar7.data;
      ws_[3].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)bVar7.size;
      if (bVar7.data == (void *)0x0) goto LAB_0015cbba;
    }
    sVar3 = fio_read(sockfd,ws_[3].on_shutdown + (long)ws_[3].on_data,
                     (long)ws_[3].on_ready - (long)ws_[3].on_shutdown);
    if (sVar3 < 1) {
      return;
    }
    p_Var4 = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)
             websocket_consume(ws_[3].on_data,(uint64_t)(ws_[3].on_shutdown + sVar3),ws_,
                               ~*(byte *)((long)&ws_[3].ping + 1) & 1);
    ws_[3].on_shutdown = p_Var4;
    fio_force_event(sockfd,FIO_EVENT_ON_DATA);
    return;
  }
LAB_0015cbba:
  websocket_close((ws_s *)ws_);
  return;
}

Assistant:

static void on_data(intptr_t sockfd, fio_protocol_s *ws_) {
  ws_s *const ws = (ws_s *)ws_;
  if (ws == NULL)
    return;
  struct websocket_packet_info_s info =
      websocket_buffer_peek(ws->buffer.data, ws->length);
  const uint64_t raw_length = info.packet_length + info.head_length;
  /* test expected data amount */
  if (ws->max_msg_size < raw_length) {
    /* too big */
    websocket_close(ws);
    return;
  }
  /* test buffer capacity */
  if (raw_length > ws->buffer.size) {
    ws->buffer.size = (size_t)raw_length;
    ws->buffer = resize_ws_buffer(ws, ws->buffer);
    if (!ws->buffer.data) {
      // no memory.
      websocket_close(ws);
      return;
    }
  }

  const ssize_t len = fio_read(sockfd, (uint8_t *)ws->buffer.data + ws->length,
                               ws->buffer.size - ws->length);
  if (len <= 0) {
    return;
  }
  ws->length = websocket_consume(ws->buffer.data, ws->length + len, ws,
                                 (~(ws->is_client) & 1));

  fio_force_event(sockfd, FIO_EVENT_ON_DATA);
}